

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentWordCount capnp::_::verifySegment(ArrayPtr<const_capnp::word> segment)

{
  bool bVar1;
  SegmentWordCount SVar2;
  word *pwVar3;
  size_t size;
  Fault local_60;
  Fault f;
  ulong local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  ArrayPtr<const_capnp::word> segment_local;
  
  _kjCondition._32_8_ = segment.ptr;
  pwVar3 = kj::ArrayPtr<const_capnp::word>::begin
                     ((ArrayPtr<const_capnp::word> *)&_kjCondition.result);
  local_50 = (ulong)pwVar3 & 7;
  local_48 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_40,&local_48,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[586]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
               ,0x53,FAILED,"reinterpret_cast<uintptr_t>(segment.begin()) % sizeof(void*) == 0",
               "_kjCondition,\"Detected unaligned data in Cap\'n Proto message. Messages must be aligned to the \" \"architecture\'s word size. Yes, even on x86: Unaligned access is undefined behavior \" \"under the C/C++ language standard, and compilers can and do assume alignment for the \" \"purpose of optimizations. Unaligned access may lead to crashes or subtle corruption. \" \"For example, GCC will use SIMD instructions in optimizations, and those instrsuctions \" \"require alignment. If you really insist on taking your changes with unaligned data, \" \"compile the Cap\'n Proto library with -DCAPNP_ALLOW_UNALIGNED to remove this check.\""
               ,(DebugComparison<unsigned_long,_int> *)local_40,
               (char (*) [586])
               "Detected unaligned data in Cap\'n Proto message. Messages must be aligned to the architecture\'s word size. Yes, even on x86: Unaligned access is undefined behavior under the C/C++ language standard, and compilers can and do assume alignment for the purpose of optimizations. Unaligned access may lead to crashes or subtle corruption. For example, GCC will use SIMD instructions in optimizations, and those instrsuctions require alignment. If you really insist on taking your changes with unaligned data, compile the Cap\'n Proto library with -DCAPNP_ALLOW_UNALIGNED to remove this check."
              );
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  size = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)&_kjCondition.result);
  SVar2 = verifySegmentSize(size);
  return SVar2;
}

Assistant:

static SegmentWordCount verifySegment(kj::ArrayPtr<const word> segment) {
#if !CAPNP_ALLOW_UNALIGNED
  KJ_REQUIRE(reinterpret_cast<uintptr_t>(segment.begin()) % sizeof(void*) == 0,
      "Detected unaligned data in Cap'n Proto message. Messages must be aligned to the "
      "architecture's word size. Yes, even on x86: Unaligned access is undefined behavior "
      "under the C/C++ language standard, and compilers can and do assume alignment for the "
      "purpose of optimizations. Unaligned access may lead to crashes or subtle corruption. "
      "For example, GCC will use SIMD instructions in optimizations, and those instrsuctions "
      "require alignment. If you really insist on taking your changes with unaligned data, "
      "compile the Cap'n Proto library with -DCAPNP_ALLOW_UNALIGNED to remove this check.") {
    break;
  }
#endif
  return verifySegmentSize(segment.size());
}